

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_dr_prediction_z2_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  undefined4 uVar5;
  long lVar6;
  undefined4 uVar7;
  short sVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  undefined4 uVar15;
  int iVar16;
  undefined4 uVar17;
  short sVar18;
  short sVar19;
  uint uVar20;
  undefined4 uVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 in_ZMM4 [64];
  ushort uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar52 [16];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint local_58;
  
  auVar29 = _DAT_00513f30;
  auVar28 = _DAT_00513f10;
  auVar26._0_2_ = (undefined2)dy;
  auVar43 = in_ZMM4._0_16_;
  bVar4 = (byte)upsample_above;
  if (bw == 8) {
    iVar11 = -1 << (bVar4 & 0x1f);
    if (0 < bh) {
      auVar45._0_2_ = (undefined2)(-1 << ((byte)upsample_left & 0x1f));
      auVar45._2_2_ = auVar45._0_2_;
      auVar45._4_2_ = auVar45._0_2_;
      auVar45._6_2_ = auVar45._0_2_;
      auVar45._8_2_ = auVar45._0_2_;
      auVar45._10_2_ = auVar45._0_2_;
      auVar45._12_2_ = auVar45._0_2_;
      auVar45._14_2_ = auVar45._0_2_;
      auVar29._2_2_ = auVar26._0_2_;
      auVar29._0_2_ = auVar26._0_2_;
      auVar29._4_2_ = auVar26._0_2_;
      auVar29._6_2_ = auVar26._0_2_;
      auVar29._8_2_ = auVar26._0_2_;
      auVar29._10_2_ = auVar26._0_2_;
      auVar29._12_2_ = auVar26._0_2_;
      auVar29._14_2_ = auVar26._0_2_;
      auVar52 = vpmullw_avx(auVar29,_DAT_00513ef0);
      auVar29 = vpsrlw_avx(auVar52,1);
      auVar29 = vpand_avx(auVar29,_DAT_00513f00);
      iVar14 = -dx;
      auVar26 = vpcmpeqd_avx(auVar43,auVar43);
      auVar34._8_2_ = 0x10;
      auVar34._0_8_ = 0x10001000100010;
      auVar34._10_2_ = 0x10;
      auVar34._12_2_ = 0x10;
      auVar34._14_2_ = 0x10;
      auVar34._16_2_ = 0x10;
      auVar34._18_2_ = 0x10;
      auVar34._20_2_ = 0x10;
      auVar34._22_2_ = 0x10;
      auVar34._24_2_ = 0x10;
      auVar34._26_2_ = 0x10;
      auVar34._28_2_ = 0x10;
      auVar34._30_2_ = 0x10;
      sVar18 = 0;
      iVar16 = dx;
      do {
        uVar22 = iVar14 >> (6 - bVar4 & 0x1f);
        iVar9 = (int)(~uVar22 + iVar11) >> (bVar4 & 0x1f);
        if (iVar11 + -1 <= (int)uVar22) {
          iVar9 = 0;
        }
        uVar20 = (int)((iVar11 + upsample_above) - uVar22) >> (bVar4 & 0x1f);
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        if (7 < (int)uVar20) {
          uVar20 = 8;
        }
        auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (iVar9 < 8) {
          auVar43 = *(undefined1 (*) [16])(above + (long)iVar9 + (long)(int)uVar22);
          auVar49._0_2_ = (undefined2)iVar16;
          auVar49._2_2_ = auVar49._0_2_;
          auVar49._4_2_ = auVar49._0_2_;
          auVar49._6_2_ = auVar49._0_2_;
          auVar49._8_2_ = auVar49._0_2_;
          auVar49._10_2_ = auVar49._0_2_;
          auVar49._12_2_ = auVar49._0_2_;
          auVar49._14_2_ = auVar49._0_2_;
          auVar49 = vpsubw_avx(auVar28,auVar49);
          if (upsample_above == 0) {
            auVar54 = vpsrldq_avx(auVar43,1);
            auVar55 = vpshufb_avx(auVar43,(undefined1  [16])LoadMaskx[iVar9]);
            auVar43 = vpshufb_avx(auVar54,(undefined1  [16])LoadMaskx[iVar9]);
          }
          else {
            auVar55 = vpshufb_avx(auVar43,(undefined1  [16])EvenOddMaskx[iVar9]);
            auVar43 = vpsrldq_avx(auVar55,8);
            auVar49 = vpsllw_avx(auVar49,ZEXT416((uint)upsample_above));
          }
          auVar49 = vpsrlw_avx(auVar49,1);
          auVar54._8_8_ = 0x1f001f001f001f;
          auVar54._0_8_ = 0x1f001f001f001f;
          auVar49 = vpand_avx(auVar49,auVar54);
          auVar36._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar49;
          auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar49 = vpmovzxbw_avx(auVar55);
          auVar38._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar49;
          auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
          auVar43 = vpmovzxbw_avx(auVar43);
          auVar40._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar43;
          auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
        }
        if ((int)uVar22 < iVar11) {
          auVar43._2_2_ = sVar18;
          auVar43._0_2_ = sVar18;
          auVar43._4_2_ = sVar18;
          auVar43._6_2_ = sVar18;
          auVar43._8_2_ = sVar18;
          auVar43._10_2_ = sVar18;
          auVar43._12_2_ = sVar18;
          auVar43._14_2_ = sVar18;
          auVar43 = vpaddw_avx(auVar43,auVar52);
          auVar49 = auVar29;
          if (upsample_left != 0) {
            auVar49 = vpsllw_avx(auVar43,ZEXT416((uint)upsample_left));
            auVar49 = vpsrlw_avx(auVar49,1);
            auVar55._8_8_ = 0x1f001f001f001f;
            auVar55._0_8_ = 0x1f001f001f001f;
            auVar49 = vpand_avx(auVar49,auVar55);
          }
          auVar55 = vpsraw_avx(auVar43,ZEXT416(6 - upsample_left));
          auVar43 = vpcmpgtw_avx(auVar45,auVar55);
          auVar43 = vpandn_avx(auVar43,auVar55);
          uVar5 = vpextrw_avx(auVar43,1);
          uVar17 = vpextrw_avx(auVar43,2);
          uVar10 = vpextrw_avx(auVar43,3);
          uVar21 = vpextrw_avx(auVar43,4);
          uVar23 = vpextrw_avx(auVar43,5);
          uVar7 = vpextrw_avx(auVar43,6);
          uVar15 = vpextrw_avx(auVar43,7);
          auVar55 = vpinsrw_avx(ZEXT116(left[auVar43._0_2_]),(uint)left[(short)uVar5],1);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar17],2);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar10],3);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar21],4);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar23],5);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar7],6);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar15],7);
          auVar43 = vpsubw_avx(auVar43,auVar26);
          uVar5 = vpextrw_avx(auVar43,1);
          uVar7 = vpextrw_avx(auVar43,2);
          uVar15 = vpextrw_avx(auVar43,3);
          uVar23 = vpextrw_avx(auVar43,4);
          uVar21 = vpextrw_avx(auVar43,5);
          uVar17 = vpextrw_avx(auVar43,6);
          uVar10 = vpextrw_avx(auVar43,7);
          auVar43 = vpinsrw_avx(ZEXT116(left[auVar43._0_2_]),(uint)left[(short)uVar5],1);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar7],2);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar15],3);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar23],4);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar21],5);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar17],6);
          auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar10],7);
          auVar47._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar38._0_16_;
          auVar47._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar55;
          auVar46._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar40._0_16_;
          auVar46._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar43;
          auVar39._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar36._0_16_;
          auVar39._16_16_ = ZEXT116(0) * auVar36._16_16_ + ZEXT116(1) * auVar49;
          auVar40 = auVar46;
          auVar36 = auVar39;
          auVar38 = auVar47;
        }
        auVar40 = vpsubw_avx2(auVar40,auVar38);
        auVar40 = vpmullw_avx2(auVar40,auVar36);
        auVar36 = vpsllw_avx2(auVar38,5);
        auVar40 = vpaddw_avx2(auVar40,auVar36);
        auVar40 = vpaddw_avx2(auVar40,auVar34);
        auVar40 = vpsrlw_avx2(auVar40,5);
        auVar43 = vpackuswb_avx(auVar40._0_16_,auVar40._0_16_);
        auVar49 = vpackuswb_avx(auVar40._16_16_,auVar40._16_16_);
        auVar43 = vpblendvb_avx(auVar43,auVar49,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(long *)dst = auVar43._0_8_;
        dst = dst + stride;
        sVar18 = sVar18 + 0x40;
        iVar14 = iVar14 - dx;
        iVar16 = iVar16 + dx;
        bh = bh + -1;
      } while (bh != 0);
    }
  }
  else if (bw == 4) {
    iVar11 = -1 << (bVar4 & 0x1f);
    if (0 < bh) {
      auVar24._0_2_ = (undefined2)(-1 << ((byte)upsample_left & 0x1f));
      auVar24._2_2_ = auVar24._0_2_;
      auVar24._4_2_ = auVar24._0_2_;
      auVar24._6_2_ = auVar24._0_2_;
      auVar24._8_2_ = auVar24._0_2_;
      auVar24._10_2_ = auVar24._0_2_;
      auVar24._12_2_ = auVar24._0_2_;
      auVar24._14_2_ = auVar24._0_2_;
      auVar26._2_2_ = auVar26._0_2_;
      auVar26._4_2_ = auVar26._0_2_;
      auVar26._6_2_ = auVar26._0_2_;
      auVar26._8_2_ = auVar26._0_2_;
      auVar26._10_2_ = auVar26._0_2_;
      auVar26._12_2_ = auVar26._0_2_;
      auVar26._14_2_ = auVar26._0_2_;
      auVar52 = vpmullw_avx(auVar26,_DAT_00513f20);
      auVar28 = vpsrlw_avx(auVar52,1);
      auVar28 = vpand_avx(auVar28,_DAT_00513f00);
      iVar14 = -dx;
      auVar26 = vpcmpeqd_avx(auVar43,auVar43);
      auVar33._8_8_ = 0x1f001f001f001f;
      auVar33._0_8_ = 0x1f001f001f001f;
      auVar37._8_2_ = 0x10;
      auVar37._0_8_ = 0x10001000100010;
      auVar37._10_2_ = 0x10;
      auVar37._12_2_ = 0x10;
      auVar37._14_2_ = 0x10;
      sVar18 = 0;
      iVar16 = dx;
      do {
        uVar22 = iVar14 >> (6 - bVar4 & 0x1f);
        iVar9 = (int)(~uVar22 + iVar11) >> (bVar4 & 0x1f);
        if (iVar11 + -1 <= (int)uVar22) {
          iVar9 = 0;
        }
        uVar20 = (int)((iVar11 + upsample_above) - uVar22) >> (bVar4 & 0x1f);
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        if (3 < (int)uVar20) {
          uVar20 = 4;
        }
        auVar43 = (undefined1  [16])0x0;
        auVar49 = (undefined1  [16])0x0;
        auVar45 = (undefined1  [16])0x0;
        if (iVar9 < 4) {
          auVar42._0_2_ = (undefined2)iVar16;
          auVar42._2_2_ = auVar42._0_2_;
          auVar42._4_2_ = auVar42._0_2_;
          auVar42._6_2_ = auVar42._0_2_;
          auVar42._8_2_ = auVar42._0_2_;
          auVar42._10_2_ = auVar42._0_2_;
          auVar42._12_2_ = auVar42._0_2_;
          auVar42._14_2_ = auVar42._0_2_;
          auVar43 = vpsubw_avx(auVar29,auVar42);
          if (upsample_above == 0) {
            auVar45 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)iVar9 + (long)(int)uVar22),
                                  (undefined1  [16])LoadMaskx[iVar9]);
            auVar49 = vpsrldq_avx(auVar45,1);
          }
          else {
            auVar45 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)iVar9 + (long)(int)uVar22),
                                  (undefined1  [16])EvenOddMaskx[iVar9]);
            auVar49 = vpsrldq_avx(auVar45,8);
            auVar43 = vpsllw_avx(auVar43,ZEXT416((uint)upsample_above));
          }
          auVar43 = vpsrlw_avx(auVar43,1);
          auVar43 = vpand_avx(auVar43,auVar33);
          auVar45 = vpmovzxbw_avx(auVar45);
          auVar49 = vpmovzxbw_avx(auVar49);
        }
        if ((int)uVar22 < iVar11) {
          auVar53._2_2_ = sVar18;
          auVar53._0_2_ = sVar18;
          auVar53._4_2_ = sVar18;
          auVar53._6_2_ = sVar18;
          auVar53._8_2_ = sVar18;
          auVar53._10_2_ = sVar18;
          auVar53._12_2_ = sVar18;
          auVar53._14_2_ = sVar18;
          auVar55 = vpaddw_avx(auVar53,auVar52);
          auVar54 = auVar28;
          if (upsample_left != 0) {
            auVar54 = vpsllw_avx(auVar55,ZEXT416((uint)upsample_left));
            auVar54 = vpsrlw_avx(auVar54,1);
            auVar54 = vpand_avx(auVar54,auVar33);
          }
          auVar42 = vpsraw_avx(auVar55,ZEXT416(6 - upsample_left));
          auVar55 = vpcmpgtw_avx(auVar24,auVar42);
          auVar55 = vpandn_avx(auVar55,auVar42);
          uVar5 = vpextrw_avx(auVar55,1);
          uVar7 = vpextrw_avx(auVar55,2);
          uVar23 = vpextrw_avx(auVar55,3);
          auVar42 = vpinsrw_avx(ZEXT116(left[auVar55._0_2_]),(uint)left[(short)uVar5],1);
          auVar42 = vpinsrw_avx(auVar42,(uint)left[(short)uVar7],2);
          auVar42 = vpinsrw_avx(auVar42,(uint)left[(short)uVar23],3);
          auVar55 = vpsubw_avx(auVar55,auVar26);
          uVar5 = vpextrw_avx(auVar55,1);
          uVar7 = vpextrw_avx(auVar55,2);
          uVar23 = vpextrw_avx(auVar55,3);
          auVar55 = vpinsrw_avx(ZEXT116(left[auVar55._0_2_]),(uint)left[(short)uVar5],1);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar7],2);
          auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar23],3);
          auVar45 = vpunpcklqdq_avx(auVar45,auVar42);
          auVar49 = vpunpcklqdq_avx(auVar49,auVar55);
          auVar43 = vpunpcklqdq_avx(auVar43,auVar54);
        }
        auVar49 = vpsubw_avx(auVar49,auVar45);
        auVar43 = vpmullw_avx(auVar49,auVar43);
        auVar45 = vpsllw_avx(auVar45,5);
        auVar43 = vpaddw_avx(auVar43,auVar45);
        auVar43 = vpaddw_avx(auVar43,auVar37);
        auVar43 = vpsrlw_avx(auVar43,5);
        auVar43 = vpackuswb_avx(auVar43,auVar43);
        auVar45 = vpshufd_avx(auVar43,0x55);
        auVar43 = vpblendvb_avx(auVar43,auVar45,*(undefined1 (*) [16])BaseMask[uVar20]);
        *(int *)dst = auVar43._0_4_;
        dst = dst + stride;
        sVar18 = sVar18 + 0x40;
        iVar14 = iVar14 - dx;
        iVar16 = iVar16 + dx;
        bh = bh + -1;
      } while (bh != 0);
    }
  }
  else if (0 < bh) {
    auVar25._2_2_ = auVar26._0_2_;
    auVar25._0_2_ = auVar26._0_2_;
    auVar25._4_2_ = auVar26._0_2_;
    auVar25._6_2_ = auVar26._0_2_;
    auVar25._8_2_ = auVar26._0_2_;
    auVar25._10_2_ = auVar26._0_2_;
    auVar25._12_2_ = auVar26._0_2_;
    auVar25._14_2_ = auVar26._0_2_;
    auVar25._16_2_ = auVar26._0_2_;
    auVar25._18_2_ = auVar26._0_2_;
    auVar25._20_2_ = auVar26._0_2_;
    auVar25._22_2_ = auVar26._0_2_;
    auVar25._24_2_ = auVar26._0_2_;
    auVar25._26_2_ = auVar26._0_2_;
    auVar25._28_2_ = auVar26._0_2_;
    auVar25._30_2_ = auVar26._0_2_;
    auVar27._8_2_ = 0x10;
    auVar27._0_8_ = 0x10001000100010;
    auVar27._10_2_ = 0x10;
    auVar27._12_2_ = 0x10;
    auVar27._14_2_ = 0x10;
    auVar27._16_2_ = 0x10;
    auVar27._18_2_ = 0x10;
    auVar27._20_2_ = 0x10;
    auVar27._22_2_ = 0x10;
    auVar27._24_2_ = 0x10;
    auVar27._26_2_ = 0x10;
    auVar27._28_2_ = 0x10;
    auVar27._30_2_ = 0x10;
    auVar40 = vpmovsxbw_avx2(_DAT_00515560);
    auVar30._8_2_ = 0x7fff;
    auVar30._0_8_ = 0x7fff7fff7fff7fff;
    auVar30._10_2_ = 0x7fff;
    auVar30._12_2_ = 0x7fff;
    auVar30._14_2_ = 0x7fff;
    auVar30._16_2_ = 0x7fff;
    auVar30._18_2_ = 0x7fff;
    auVar30._20_2_ = 0x7fff;
    auVar30._22_2_ = 0x7fff;
    auVar30._24_2_ = 0x7fff;
    auVar30._26_2_ = 0x7fff;
    auVar30._28_2_ = 0x7fff;
    auVar30._30_2_ = 0x7fff;
    auVar34 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
    local_58 = 0;
    do {
      if (0 < bw) {
        uVar20 = (int)(~local_58 * dx) >> 6;
        uVar22 = ~uVar20;
        uVar1 = (ushort)(~local_58 * dx >> 1);
        uVar31 = uVar1 & 0x1f;
        auVar32._0_8_ = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1))) & 0x1f001f001f001f;
        auVar32._8_2_ = uVar31;
        auVar32._10_2_ = uVar31;
        auVar32._12_2_ = uVar31;
        auVar32._14_2_ = uVar31;
        auVar32._16_2_ = uVar31;
        auVar32._18_2_ = uVar31;
        auVar32._20_2_ = uVar31;
        auVar32._22_2_ = uVar31;
        auVar32._24_2_ = uVar31;
        auVar32._26_2_ = uVar31;
        auVar32._28_2_ = uVar31;
        auVar32._30_2_ = uVar31;
        auVar35._0_2_ = (undefined2)local_58;
        auVar35._2_2_ = auVar35._0_2_;
        auVar35._4_2_ = auVar35._0_2_;
        auVar35._6_2_ = auVar35._0_2_;
        auVar35._8_2_ = auVar35._0_2_;
        auVar35._10_2_ = auVar35._0_2_;
        auVar35._12_2_ = auVar35._0_2_;
        auVar35._14_2_ = auVar35._0_2_;
        auVar35._16_2_ = auVar35._0_2_;
        auVar35._18_2_ = auVar35._0_2_;
        auVar35._20_2_ = auVar35._0_2_;
        auVar35._22_2_ = auVar35._0_2_;
        auVar35._24_2_ = auVar35._0_2_;
        auVar35._26_2_ = auVar35._0_2_;
        auVar35._28_2_ = auVar35._0_2_;
        auVar35._30_2_ = auVar35._0_2_;
        auVar36 = vpsllw_avx2(auVar35,6);
        lVar6 = 0;
        do {
          uVar3 = uVar22 - 1;
          if (-3 < (int)uVar20 + lVar6) {
            uVar3 = 0;
          }
          uVar12 = 0;
          if (0 < (int)uVar22) {
            uVar12 = uVar22;
          }
          uVar13 = (ulong)uVar12;
          if (0xf < (int)uVar12) {
            uVar13 = 0x10;
          }
          auVar29 = (undefined1  [16])0x0;
          auVar28 = (undefined1  [16])0x0;
          if ((int)uVar3 < 0x10) {
            lVar2 = (ulong)uVar3 + (long)(int)uVar20;
            auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + lVar6 + lVar2),
                                  (undefined1  [16])LoadMaskx[uVar3]);
            auVar26 = vpshufb_avx(*(undefined1 (*) [16])(above + lVar6 + 1 + lVar2),
                                  (undefined1  [16])LoadMaskx[uVar3]);
            auVar38 = vpmovzxbw_avx2(auVar28);
            auVar39 = vpmovzxbw_avx2(auVar26);
            auVar39 = vpsubw_avx2(auVar39,auVar38);
            auVar39 = vpmullw_avx2(auVar39,auVar32);
            auVar38 = vpsllw_avx2(auVar38,5);
            auVar38 = vpaddw_avx2(auVar38,auVar27);
            auVar38 = vpaddw_avx2(auVar39,auVar38);
            auVar38 = vpsrlw_avx2(auVar38,5);
            auVar28 = vpackuswb_avx(auVar38._0_16_,auVar38._16_16_);
          }
          if ((int)uVar20 < -1) {
            auVar41._0_2_ = (undefined2)lVar6;
            auVar41._2_2_ = auVar41._0_2_;
            auVar41._4_2_ = auVar41._0_2_;
            auVar41._6_2_ = auVar41._0_2_;
            auVar41._8_2_ = auVar41._0_2_;
            auVar41._10_2_ = auVar41._0_2_;
            auVar41._12_2_ = auVar41._0_2_;
            auVar41._14_2_ = auVar41._0_2_;
            auVar41._16_2_ = auVar41._0_2_;
            auVar41._18_2_ = auVar41._0_2_;
            auVar41._20_2_ = auVar41._0_2_;
            auVar41._22_2_ = auVar41._0_2_;
            auVar41._24_2_ = auVar41._0_2_;
            auVar41._26_2_ = auVar41._0_2_;
            auVar41._28_2_ = auVar41._0_2_;
            auVar41._30_2_ = auVar41._0_2_;
            auVar38 = vpaddw_avx2(auVar41,auVar40);
            auVar38 = vpmullw_avx2(auVar38,auVar25);
            auVar38 = vpminuw_avx2(auVar38,auVar30);
            auVar39 = vpsubw_avx2(auVar36,auVar38);
            auVar47 = vpsraw_avx2(auVar39,6);
            auVar38 = vpmaxsw_avx2(auVar47,auVar34);
            uVar5 = vpextrw_avx(auVar38._16_16_,7);
            sVar18 = (short)uVar5;
            sVar19 = auVar38._0_2_ - sVar18;
            if (sVar19 < 0x10) {
              auVar47 = vpshufhw_avx2(auVar38,0xff);
              auVar47 = vpshufd_avx2(auVar47,0xaa);
              auVar47 = vpermq_avx2(auVar47,0xaa);
              auVar38 = vpsubw_avx2(auVar38,auVar47);
              sVar8 = sVar19 + 3;
              if (-1 < sVar19) {
                sVar8 = sVar19;
              }
              auVar26 = vpmaskmovd_avx2(*(undefined1 (*) [16])
                                         LoadMaskz2[(short)((uint)(int)sVar8 >> 2)],
                                        *(undefined1 (*) [16])(left + sVar18));
              auVar29 = vpacksswb_avx(auVar38._0_16_,auVar38._16_16_);
              auVar43 = vpmaskmovd_avx2(*(undefined1 (*) [16])
                                         LoadMaskz2[(short)((uint)(int)sVar8 >> 2)],
                                        *(undefined1 (*) [16])(left + (long)sVar18 + 1));
              auVar26 = vpshufb_avx(auVar26,auVar29);
              auVar29 = vpshufb_avx(auVar43,auVar29);
              auVar44 = vpmovzxbw_avx2(auVar26);
              auVar48 = vpmovzxbw_avx2(auVar29);
            }
            else {
              auVar50._8_2_ = 0xfffe;
              auVar50._0_8_ = 0xfffefffefffefffe;
              auVar50._10_2_ = 0xfffe;
              auVar50._12_2_ = 0xfffe;
              auVar50._14_2_ = 0xfffe;
              auVar50._16_2_ = 0xfffe;
              auVar50._18_2_ = 0xfffe;
              auVar50._20_2_ = 0xfffe;
              auVar50._22_2_ = 0xfffe;
              auVar50._24_2_ = 0xfffe;
              auVar50._26_2_ = 0xfffe;
              auVar50._28_2_ = 0xfffe;
              auVar50._30_2_ = 0xfffe;
              auVar47 = vpcmpgtw_avx2(auVar47,auVar50);
              auVar38 = vpand_avx2(auVar47,auVar38);
              auVar43 = auVar38._0_16_;
              auVar26 = auVar38._16_16_;
              uVar5 = vpextrw_avx(auVar26,1);
              auVar29 = vpinsrw_avx(ZEXT116(left[auVar38._16_2_]),(uint)left[(short)uVar5],1);
              uVar5 = vpextrw_avx(auVar26,2);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],2);
              uVar5 = vpextrw_avx(auVar26,3);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],3);
              uVar5 = vpextrw_avx(auVar26,4);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],4);
              uVar5 = vpextrw_avx(auVar26,5);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],5);
              uVar5 = vpextrw_avx(auVar26,6);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],6);
              uVar5 = vpextrw_avx(auVar26,7);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar5],7);
              uVar5 = vpextrw_avx(auVar43,1);
              auVar26 = vpinsrw_avx(ZEXT116(left[auVar38._0_2_]),(uint)left[(short)uVar5],1);
              uVar5 = vpextrw_avx(auVar43,2);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],2);
              uVar5 = vpextrw_avx(auVar43,3);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],3);
              uVar5 = vpextrw_avx(auVar43,4);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],4);
              uVar5 = vpextrw_avx(auVar43,5);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],5);
              uVar5 = vpextrw_avx(auVar43,6);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],6);
              uVar5 = vpextrw_avx(auVar43,7);
              auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar5],7);
              auVar38 = vpsubw_avx2(auVar38,auVar34);
              auVar45 = auVar38._0_16_;
              auVar52 = auVar38._16_16_;
              uVar5 = vpextrw_avx(auVar52,1);
              auVar43 = vpinsrw_avx(ZEXT116(left[auVar38._16_2_]),(uint)left[(short)uVar5],1);
              uVar5 = vpextrw_avx(auVar52,2);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],2);
              uVar5 = vpextrw_avx(auVar52,3);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],3);
              uVar5 = vpextrw_avx(auVar52,4);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],4);
              uVar5 = vpextrw_avx(auVar52,5);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],5);
              uVar5 = vpextrw_avx(auVar52,6);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],6);
              uVar5 = vpextrw_avx(auVar52,7);
              auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar5],7);
              uVar5 = vpextrw_avx(auVar45,1);
              auVar52 = vpinsrw_avx(ZEXT116(left[auVar38._0_2_]),(uint)left[(short)uVar5],1);
              uVar5 = vpextrw_avx(auVar45,2);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],2);
              uVar5 = vpextrw_avx(auVar45,3);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],3);
              uVar5 = vpextrw_avx(auVar45,4);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],4);
              uVar5 = vpextrw_avx(auVar45,5);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],5);
              uVar5 = vpextrw_avx(auVar45,6);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],6);
              uVar5 = vpextrw_avx(auVar45,7);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar5],7);
              auVar44._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar26;
              auVar44._16_16_ = ZEXT116(1) * auVar29;
              auVar48._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar52;
              auVar48._16_16_ = ZEXT116(1) * auVar43;
            }
            auVar38 = vpsrlw_avx2(auVar39,1);
            auVar51._8_2_ = 0x1f;
            auVar51._0_8_ = 0x1f001f001f001f;
            auVar51._10_2_ = 0x1f;
            auVar51._12_2_ = 0x1f;
            auVar51._14_2_ = 0x1f;
            auVar51._16_2_ = 0x1f;
            auVar51._18_2_ = 0x1f;
            auVar51._20_2_ = 0x1f;
            auVar51._22_2_ = 0x1f;
            auVar51._24_2_ = 0x1f;
            auVar51._26_2_ = 0x1f;
            auVar51._28_2_ = 0x1f;
            auVar51._30_2_ = 0x1f;
            auVar38 = vpand_avx2(auVar38,auVar51);
            auVar39 = vpsubw_avx2(auVar48,auVar44);
            auVar39 = vpmullw_avx2(auVar39,auVar38);
            auVar38 = vpsllw_avx2(auVar44,5);
            auVar38 = vpaddw_avx2(auVar38,auVar27);
            auVar38 = vpaddw_avx2(auVar39,auVar38);
            auVar38 = vpsrlw_avx2(auVar38,5);
            auVar29 = vpackuswb_avx(auVar38._0_16_,auVar38._16_16_);
          }
          auVar28 = vpblendvb_avx(auVar28,auVar29,*(undefined1 (*) [16])BaseMask[uVar13]);
          *(undefined1 (*) [16])(dst + lVar6) = auVar28;
          lVar6 = lVar6 + 0x10;
          uVar22 = uVar22 - 0x10;
        } while (lVar6 < bw);
      }
      local_58 = local_58 + 1;
      dst = dst + stride;
    } while (local_58 != bh);
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int upsample_left, int dx,
                               int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                upsample_above, upsample_left, dx, dy);
      break;
  }
  return;
}